

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

void sexp_string_utf8_set(sexp ctx,sexp str,sexp index,sexp ch)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int c_00;
  int iVar4;
  int len_00;
  sexp self;
  sexp psVar5;
  int iVar6;
  undefined8 in_RCX;
  ulong in_RDX;
  long in_RSI;
  int len;
  int new_len;
  int old_len;
  int c;
  int i;
  uchar *q;
  uchar *p;
  sexp b;
  sexp_sint_t in_stack_ffffffffffffffc8;
  void *__dest;
  sexp in_stack_ffffffffffffffd8;
  
  auVar2._8_8_ = (long)in_RDX >> 0x3f;
  auVar2._0_8_ = in_RDX & 0xfffffffffffffffd;
  iVar3 = SUB164(auVar2 / SEXT816(8),0);
  c_00 = (int)((ulong)in_RCX >> 8);
  self = (sexp)(*(long *)(in_RSI + 8) + 0x10 + *(long *)(in_RSI + 0x10) + (long)iVar3);
  iVar4 = sexp_utf8_initial_byte_count((uint)(byte)self->tag);
  len_00 = sexp_utf8_char_byte_count(c_00);
  if (((*(byte *)(in_RSI + 5) >> 4 & 1) != 0) || (iVar4 != len_00)) {
    uVar1 = *(undefined8 *)(in_RSI + 0x18);
    iVar6 = len_00 - iVar4;
    psVar5 = sexp_make_bytes_op(in_stack_ffffffffffffffd8,self,in_stack_ffffffffffffffc8,
                                (sexp)CONCAT44(iVar3,c_00),(sexp)CONCAT44(iVar4,len_00));
    if ((((ulong)psVar5 & 3) != 0) || (psVar5->tag != 0x13)) {
      __dest = (void *)((long)&psVar5->value + 8);
      memcpy(__dest,(void *)(*(long *)(in_RSI + 8) + 0x10 + *(long *)(in_RSI + 0x10)),(long)iVar3);
      memcpy((void *)((long)__dest + (long)len_00 + (long)iVar3),
             (void *)((long)&self->tag + (long)iVar4),
             (long)(((((int)uVar1 + iVar6) - iVar3) - len_00) + 1));
      *(sexp *)(in_RSI + 8) = psVar5;
      self = (sexp)((long)__dest + (long)iVar3);
    }
    *(long *)(in_RSI + 0x18) = (long)(len_00 - iVar4) + *(long *)(in_RSI + 0x18);
    *(byte *)(in_RSI + 5) = *(byte *)(in_RSI + 5) & 0xef;
  }
  sexp_utf8_encode_char((uchar *)self,len_00,c_00);
  return;
}

Assistant:

void sexp_string_utf8_set (sexp ctx, sexp str, sexp index, sexp ch) {
  sexp b;
  unsigned char *p, *q;
  int i = sexp_unbox_string_cursor(index), c = sexp_unbox_character(ch),
    old_len, new_len, len;
  p = (unsigned char*)sexp_string_data(str) + i;
  old_len = sexp_utf8_initial_byte_count(*p);
  new_len = sexp_utf8_char_byte_count(c);
  if (sexp_copy_on_writep(str) || old_len != new_len) { /* resize bytes if needed */
    len = sexp_string_size(str)+(new_len-old_len);
    b = sexp_make_bytes(ctx, sexp_make_fixnum(len), SEXP_VOID);
    if (! sexp_exceptionp(b)) {
      q = (unsigned char*)sexp_bytes_data(b);
      memcpy(q, sexp_string_data(str), i);
      memcpy(q+i+new_len, p+old_len, len-i-new_len+1);
      sexp_string_bytes(str) = b;
      p = q + i;
    }
    sexp_string_size(str) += new_len - old_len;
    sexp_copy_on_writep(str) = 0;
  }
  sexp_utf8_encode_char(p, new_len, c);
  if (old_len != new_len) {
#if SEXP_USE_STRING_INDEX_TABLE
    sexp_update_string_index_lookup(ctx, str);
#elif SEXP_USE_STRING_REF_CACHE
  sexp_cached_char_idx(str) = 0;
  sexp_cached_cursor(str) = sexp_make_string_cursor(0);
#endif
  }
}